

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_stats.h
# Opt level: O0

_Bool arena_stats_init(tsdn_t *tsdn,arena_stats_t *arena_stats)

{
  arena_stats_t *arena_stats_local;
  tsdn_t *tsdn_local;
  
  return false;
}

Assistant:

static inline bool
arena_stats_init(tsdn_t *tsdn, arena_stats_t *arena_stats) {
	if (config_debug) {
		for (size_t i = 0; i < sizeof(arena_stats_t); i++) {
			assert(((char *)arena_stats)[i] == 0);
		}
	}
	if (LOCKEDINT_MTX_INIT(arena_stats->mtx, "arena_stats",
	    WITNESS_RANK_ARENA_STATS, malloc_mutex_rank_exclusive)) {
		return true;
	}
	/* Memory is zeroed, so there is no need to clear stats. */
	return false;
}